

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::ebml_read_header(MatroskaDemuxer *this,char **doctype,int *version)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 *puVar5;
  uint32_t uStack_238;
  int levelUp;
  int64_t num_1;
  uint *local_228;
  undefined8 local_220;
  uint local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  undefined4 uStack_1a4;
  
  if (doctype != (char **)0x0) {
    *doctype = (char *)0x0;
  }
  if (version != (int *)0x0) {
    *version = 1;
  }
  uVar1 = ebml_peek_id(this,&levelUp);
  if ((uVar1 != 0x1a45dfa3) || (levelUp != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"This is not an EBML file (id=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"/");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar5 = 900;
    *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
    if (local_1c8 == &local_1b8) {
      puVar5[6] = local_1b8;
      puVar5[7] = uStack_1b4;
      puVar5[8] = uStack_1b0;
      puVar5[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar5 + 2) = local_1c8;
      *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar5 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar2 = ebml_read_master(this,&uStack_238);
  if (iVar2 < 0) {
    return iVar2;
  }
LAB_001ab19b:
  iVar2 = 0;
  do {
    while( true ) {
      if (iVar2 != 0) {
        return 0;
      }
      uVar1 = ebml_peek_id(this,&levelUp);
      if (uVar1 == 0) {
        return -1;
      }
      if (levelUp != 0) {
        return 0;
      }
      if (((1 < uVar1 - 0x4286) && (uVar1 != 0xbf)) && (uVar1 != 0xec)) break;
LAB_001ab207:
      iVar2 = ebml_read_skip(this);
    }
    if (uVar1 == 0x4282) {
      iVar3 = ebml_read_ascii(this,&uStack_238,(char **)&ss);
      if (-1 < iVar3 && doctype != (char **)0x0) {
        *doctype = (char *)CONCAT44(uStack_1a4,_ss);
        goto LAB_001ab19b;
      }
    }
    else {
      if (uVar1 != 0x4285) {
        if (uVar1 == 0x42f2) {
          iVar2 = ebml_read_uint(this,&uStack_238,&num_1);
          if (iVar2 < 0) {
            return iVar2;
          }
          if (8 < num_1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
            poVar4 = std::operator<<((ostream *)&ss,"IDs of size ");
            poVar4 = std::ostream::_M_insert<long>((long)poVar4);
            std::operator<<(poVar4," (> 8) not supported");
            puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar5 = 900;
            *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
            if (local_228 == &local_218) {
              puVar5[6] = local_218;
              puVar5[7] = uStack_214;
              puVar5[8] = uStack_210;
              puVar5[9] = uStack_20c;
            }
            else {
              *(uint **)(puVar5 + 2) = local_228;
              *(ulong *)(puVar5 + 6) = CONCAT44(uStack_214,local_218);
            }
            *(undefined8 *)(puVar5 + 4) = local_220;
            local_220 = 0;
            local_218 = local_218 & 0xffffff00;
            local_228 = &local_218;
            __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        else if (uVar1 == 0x42f3) {
          iVar2 = ebml_read_uint(this,&uStack_238,&num_1);
          if (iVar2 < 0) {
            return iVar2;
          }
          if (8 < num_1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
            poVar4 = std::operator<<((ostream *)&ss,"Integers of size ");
            poVar4 = std::ostream::_M_insert<long>((long)poVar4);
            std::operator<<(poVar4," (> 8) not supported");
            puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar5 = 900;
            *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
            if (local_208 == &local_1f8) {
              puVar5[6] = local_1f8;
              puVar5[7] = uStack_1f4;
              puVar5[8] = uStack_1f0;
              puVar5[9] = uStack_1ec;
            }
            else {
              *(uint **)(puVar5 + 2) = local_208;
              *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1f4,local_1f8);
            }
            *(undefined8 *)(puVar5 + 4) = local_200;
            local_200 = 0;
            local_1f8 = local_1f8 & 0xffffff00;
            local_208 = &local_1f8;
            __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        else {
          if (uVar1 != 0x42f7) goto LAB_001ab207;
          iVar2 = ebml_read_uint(this,&uStack_238,&num_1);
          if (iVar2 < 0) {
            return iVar2;
          }
          if (1 < num_1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
            poVar4 = std::operator<<((ostream *)&ss,"EBML version ");
            poVar4 = std::ostream::_M_insert<long>((long)poVar4);
            poVar4 = std::operator<<(poVar4," > ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
            std::operator<<(poVar4," is not supported");
            puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar5 = 900;
            *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
            if (local_1e8 == &local_1d8) {
              puVar5[6] = local_1d8;
              puVar5[7] = uStack_1d4;
              puVar5[8] = uStack_1d0;
              puVar5[9] = uStack_1cc;
            }
            else {
              *(uint **)(puVar5 + 2) = local_1e8;
              *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1d4,local_1d8);
            }
            *(undefined8 *)(puVar5 + 4) = local_1e0;
            local_1e0 = 0;
            local_1d8 = local_1d8 & 0xffffff00;
            local_1e8 = &local_1d8;
            __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        goto LAB_001ab19b;
      }
      iVar3 = ebml_read_uint(this,&uStack_238,(int64_t *)&ss);
      if (-1 < iVar3 && version != (int *)0x0) break;
    }
    iVar2 = 0;
    if (iVar3 < 0) {
      return iVar3;
    }
  } while( true );
  *version = _ss;
  goto LAB_001ab19b;
}

Assistant:

int MatroskaDemuxer::ebml_read_header(char **doctype, int *version)
{
    uint32_t id;
    int levelUp, res = 0;

    /* default init */
    if (doctype)
        *doctype = nullptr;
    if (version)
        *version = 1;

    if ((id = ebml_peek_id(&levelUp)) == 0 || levelUp != 0 || id != EBML_ID_HEADER)
    {
        THROW(ERR_MATROSKA_PARSE, "This is not an EBML file (id=" << id << "/" << EBML_ID_HEADER)
    }
    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&levelUp)) == 0)
            return -BufferedReader::DATA_EOF;

        /* end-of-header */
        if (levelUp)
            break;

        switch (id)
        {
        /* is our read version uptodate? */
        case EBML_ID_EBMLREADVERSION:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > EBML_VERSION)
            {
                THROW(ERR_MATROSKA_PARSE, "EBML version " << num << " > " << EBML_VERSION << " is not supported")
            }
            break;
        }

        /* we only handle 8 byte lengths at max */
        case EBML_ID_EBMLMAXSIZELENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "Integers of size " << num << " (> 8) not supported")
            }
            break;
        }

        /* we handle 4 byte IDs at max */
        case EBML_ID_EBMLMAXIDLENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "IDs of size " << num << " (> 8) not supported")
            }
            break;
        }

        case EBML_ID_DOCTYPE:
        {
            char *text;

            if ((res = ebml_read_ascii(&id, &text)) < 0)
                return res;
            if (doctype)
            {
                *doctype = text;
            }
            break;
        }

        case EBML_ID_DOCTYPEREADVERSION:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (version)
                *version = static_cast<int>(num);
            break;
        }
        /* we ignore these four, as they don't tell us anything we care about */
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
        case EBML_ID_EBMLVERSION:
        case EBML_ID_DOCTYPEVERSION:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown data type " << id << " in EBML header");
        }
    }

    return 0;
}